

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O1

hostent * co_gethostbyname(char *name)

{
  char *__buf;
  long lVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  hostent *__result_buf;
  void *value;
  bool bVar5;
  hostent *result;
  hostent *local_40;
  char *local_38;
  
  if (name == (char *)0x0) {
    __result_buf = (hostent *)0x0;
  }
  else {
    local_38 = name;
    if (_routine_init_hostbuf_wrap == '\0') {
      pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
      _routine_init_hostbuf_wrap = '\x01';
    }
    pvVar3 = co_getspecific(_routine_key_hostbuf_wrap);
    if (pvVar3 == (void *)0x0) {
      pvVar3 = calloc(1,0x38);
      co_setspecific(_routine_key_hostbuf_wrap,pvVar3);
    }
    if (*(long *)((long)pvVar3 + 0x20) != 0) {
      if (_routine_init_hostbuf_wrap == '\0') {
        pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
        _routine_init_hostbuf_wrap = '\x01';
      }
      pvVar3 = co_getspecific(_routine_key_hostbuf_wrap);
      if (pvVar3 == (void *)0x0) {
        pvVar3 = calloc(1,0x38);
        co_setspecific(_routine_key_hostbuf_wrap,pvVar3);
      }
      if (0x400 < *(ulong *)((long)pvVar3 + 0x28)) {
        if (_routine_init_hostbuf_wrap == '\0') {
          pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
          _routine_init_hostbuf_wrap = '\x01';
        }
        pvVar3 = co_getspecific(_routine_key_hostbuf_wrap);
        if (pvVar3 == (void *)0x0) {
          pvVar3 = calloc(1,0x38);
          co_setspecific(_routine_key_hostbuf_wrap,pvVar3);
        }
        free(*(void **)((long)pvVar3 + 0x20));
        if (_routine_init_hostbuf_wrap == '\0') {
          pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
          _routine_init_hostbuf_wrap = '\x01';
        }
        pvVar3 = co_getspecific(_routine_key_hostbuf_wrap);
        if (pvVar3 == (void *)0x0) {
          pvVar3 = calloc(1,0x38);
          co_setspecific(_routine_key_hostbuf_wrap,pvVar3);
        }
        *(undefined8 *)((long)pvVar3 + 0x20) = 0;
      }
    }
    if (_routine_init_hostbuf_wrap == '\0') {
      pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
      _routine_init_hostbuf_wrap = '\x01';
    }
    pvVar3 = co_getspecific(_routine_key_hostbuf_wrap);
    if (pvVar3 == (void *)0x0) {
      pvVar3 = calloc(1,0x38);
      co_setspecific(_routine_key_hostbuf_wrap,pvVar3);
    }
    if (*(long *)((long)pvVar3 + 0x20) == 0) {
      pvVar3 = malloc(0x400);
      if (_routine_init_hostbuf_wrap == '\0') {
        pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
        _routine_init_hostbuf_wrap = '\x01';
      }
      pvVar4 = co_getspecific(_routine_key_hostbuf_wrap);
      if (pvVar4 == (void *)0x0) {
        pvVar4 = calloc(1,0x38);
        co_setspecific(_routine_key_hostbuf_wrap,pvVar4);
      }
      *(void **)((long)pvVar4 + 0x20) = pvVar3;
      if (_routine_init_hostbuf_wrap == '\0') {
        pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
        _routine_init_hostbuf_wrap = '\x01';
      }
      pvVar3 = co_getspecific(_routine_key_hostbuf_wrap);
      if (pvVar3 == (void *)0x0) {
        pvVar3 = calloc(1,0x38);
        co_setspecific(_routine_key_hostbuf_wrap,pvVar3);
      }
      *(undefined8 *)((long)pvVar3 + 0x28) = 0x400;
    }
    if (_routine_init_hostbuf_wrap == '\0') {
      pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
      _routine_init_hostbuf_wrap = '\x01';
    }
    __result_buf = (hostent *)co_getspecific(_routine_key_hostbuf_wrap);
    if (__result_buf == (hostent *)0x0) {
      __result_buf = (hostent *)calloc(1,0x38);
      iVar2 = co_setspecific(_routine_key_hostbuf_wrap,__result_buf);
      if ((__result_buf != (hostent *)0x0) && (iVar2 != 0)) {
        free(__result_buf);
        __result_buf = (hostent *)0x0;
      }
    }
    local_40 = (hostent *)0x0;
    if (_routine_init_hostbuf_wrap == '\0') {
      pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
      _routine_init_hostbuf_wrap = '\x01';
    }
    pvVar3 = co_getspecific(_routine_key_hostbuf_wrap);
    if (pvVar3 == (void *)0x0) {
      pvVar3 = calloc(1,0x38);
      iVar2 = co_setspecific(_routine_key_hostbuf_wrap,pvVar3);
      if ((pvVar3 != (void *)0x0) && (iVar2 != 0)) {
        free(pvVar3);
        pvVar3 = (void *)0x0;
      }
    }
    while( true ) {
      if (_routine_init_hostbuf_wrap == '\0') {
        pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
        _routine_init_hostbuf_wrap = '\x01';
      }
      pvVar4 = co_getspecific(_routine_key_hostbuf_wrap);
      if (pvVar4 == (void *)0x0) {
        pvVar4 = calloc(1,0x38);
        co_setspecific(_routine_key_hostbuf_wrap,pvVar4);
      }
      __buf = *(char **)((long)pvVar4 + 0x20);
      if (_routine_init_hostbuf_wrap == '\0') {
        pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
        _routine_init_hostbuf_wrap = '\x01';
      }
      pvVar4 = co_getspecific(_routine_key_hostbuf_wrap);
      if (pvVar4 == (void *)0x0) {
        pvVar4 = calloc(1,0x38);
        co_setspecific(_routine_key_hostbuf_wrap,pvVar4);
      }
      iVar2 = gethostbyname_r(local_38,(hostent *)__result_buf,__buf,
                              *(size_t *)((long)pvVar4 + 0x28),&local_40,
                              (int *)((long)pvVar3 + 0x30));
      if (iVar2 != 0x22) break;
      bVar5 = *(int *)((long)pvVar3 + 0x30) != -1;
      if (bVar5) goto LAB_0010523c;
      if (_routine_init_hostbuf_wrap == '\0') {
        pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
        _routine_init_hostbuf_wrap = '\x01';
      }
      pvVar4 = co_getspecific(_routine_key_hostbuf_wrap);
      if (pvVar4 == (void *)0x0) {
        pvVar4 = calloc(1,0x38);
        co_setspecific(_routine_key_hostbuf_wrap,pvVar4);
      }
      free(*(void **)((long)pvVar4 + 0x20));
      if (_routine_init_hostbuf_wrap == '\0') {
        pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
        _routine_init_hostbuf_wrap = '\x01';
      }
      pvVar4 = co_getspecific(_routine_key_hostbuf_wrap);
      if (pvVar4 == (void *)0x0) {
        pvVar4 = calloc(1,0x38);
        co_setspecific(_routine_key_hostbuf_wrap,pvVar4);
      }
      lVar1 = *(long *)((long)pvVar4 + 0x28);
      if (_routine_init_hostbuf_wrap == '\0') {
        pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
        _routine_init_hostbuf_wrap = '\x01';
      }
      pvVar4 = co_getspecific(_routine_key_hostbuf_wrap);
      if (pvVar4 == (void *)0x0) {
        pvVar4 = calloc(1,0x38);
        co_setspecific(_routine_key_hostbuf_wrap,pvVar4);
      }
      *(long *)((long)pvVar4 + 0x28) = lVar1 * 2;
      if (_routine_init_hostbuf_wrap == '\0') {
        pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
        _routine_init_hostbuf_wrap = '\x01';
      }
      pvVar4 = co_getspecific(_routine_key_hostbuf_wrap);
      if (pvVar4 == (void *)0x0) {
        pvVar4 = calloc(1,0x38);
        co_setspecific(_routine_key_hostbuf_wrap,pvVar4);
      }
      pvVar4 = malloc(*(size_t *)((long)pvVar4 + 0x28));
      if (_routine_init_hostbuf_wrap == '\0') {
        pthread_once(&_routine_once_hostbuf_wrap,_routine_make_key_hostbuf_wrap);
        _routine_init_hostbuf_wrap = '\x01';
      }
      value = co_getspecific(_routine_key_hostbuf_wrap);
      if (value == (void *)0x0) {
        value = calloc(1,0x38);
        co_setspecific(_routine_key_hostbuf_wrap,value);
      }
      *(void **)((long)value + 0x20) = pvVar4;
    }
    bVar5 = true;
LAB_0010523c:
    if (__result_buf != (hostent *)local_40) {
      __result_buf = (hostent *)0x0;
    }
    if (!bVar5) {
      __result_buf = (hostent *)0x0;
    }
  }
  return __result_buf;
}

Assistant:

struct hostent *co_gethostbyname(const char *name)
{
	if (!name)
	{
		return NULL;
	}

	if (__co_hostbuf_wrap->buffer && __co_hostbuf_wrap->iBufferSize > 1024)
	{
		free(__co_hostbuf_wrap->buffer);
		__co_hostbuf_wrap->buffer = NULL;
	}
	if (!__co_hostbuf_wrap->buffer)
	{
		__co_hostbuf_wrap->buffer = (char*)malloc(1024);
		__co_hostbuf_wrap->iBufferSize = 1024;
	}

	struct hostent *host = &__co_hostbuf_wrap->host;
	struct hostent *result = NULL;
	int *h_errnop = &(__co_hostbuf_wrap->host_errno);

	int ret = -1;
	while (ret = gethostbyname_r(name, host, __co_hostbuf_wrap->buffer, 
				__co_hostbuf_wrap->iBufferSize, &result, h_errnop) == ERANGE && 
				*h_errnop == NETDB_INTERNAL )
	{
		free(__co_hostbuf_wrap->buffer);
		__co_hostbuf_wrap->iBufferSize = __co_hostbuf_wrap->iBufferSize * 2;
		__co_hostbuf_wrap->buffer = (char*)malloc(__co_hostbuf_wrap->iBufferSize);
	}

	if (ret == 0 && (host == result)) 
	{
		return host;
	}
	return NULL;
}